

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Profiler.hpp
# Opt level: O2

void __thiscall JEBDebug::Profiler::end_timer(Profiler *this)

{
  _Head_base<0UL,_JEBDebug::ProfilerSection,_false> *__k;
  pointer ptVar1;
  pointer ptVar2;
  pointer ptVar3;
  long lVar4;
  iterator iVar5;
  Duration total_time;
  pair<std::_Rb_tree_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_bool>
  pVar6;
  ProfilerData local_58;
  
  lVar4 = std::chrono::_V2::system_clock::now();
  ptVar1 = (this->call_stack_).
           super__Vector_base<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = &ptVar1[-1].
         super__Tuple_impl<0UL,_JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         .super__Head_base<0UL,_JEBDebug::ProfilerSection,_false>;
  total_time.__r =
       lVar4 - ptVar1[-1].
               super__Tuple_impl<0UL,_JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .
               super__Tuple_impl<1UL,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .
               super__Head_base<1UL,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_false>
               ._M_head_impl.__d.__r;
  iVar5 = std::
          _Rb_tree<JEBDebug::ProfilerSection,_std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>,_std::_Select1st<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>,_std::less<JEBDebug::ProfilerSection>,_std::allocator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>_>
          ::find(&(this->profiles_)._M_t,&__k->_M_head_impl);
  if ((_Rb_tree_header *)iVar5._M_node == &(this->profiles_)._M_t._M_impl.super__Rb_tree_header) {
    local_58.min_time_.__r = 0;
    local_58.max_time_.__r = 0;
    local_58.count_ = 0;
    local_58.acc_time_.__r = 0;
    pVar6 = std::
            _Rb_tree<JEBDebug::ProfilerSection,std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>,std::_Select1st<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>,std::less<JEBDebug::ProfilerSection>,std::allocator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>
            ::_M_emplace_unique<JEBDebug::ProfilerSection&,JEBDebug::ProfilerData>
                      ((_Rb_tree<JEBDebug::ProfilerSection,std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>,std::_Select1st<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>,std::less<JEBDebug::ProfilerSection>,std::allocator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>
                        *)&this->profiles_,&__k->_M_head_impl,&local_58);
    iVar5._M_node = (_Base_ptr)pVar6.first._M_node;
    local_58.count_ = (size_t)iVar5._M_node;
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>,std::allocator<std::_Rb_tree_const_iterator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>>
    ::
    emplace_back<std::_Rb_tree_const_iterator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>
              ((vector<std::_Rb_tree_const_iterator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>,std::allocator<std::_Rb_tree_const_iterator<std::pair<JEBDebug::ProfilerSection_const,JEBDebug::ProfilerData>>>>
                *)&this->sequence_,
               (_Rb_tree_const_iterator<std::pair<const_JEBDebug::ProfilerSection,_JEBDebug::ProfilerData>_>
                *)&local_58);
  }
  ProfilerData::add_time
            ((ProfilerData *)&iVar5._M_node[2]._M_right,total_time,
             (Duration)
             (total_time.__r -
             ptVar1[-1].
             super__Tuple_impl<0UL,_JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .
             super__Tuple_impl<1UL,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .super__Tuple_impl<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
             super__Head_base<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_false>
             ._M_head_impl.__r));
  ptVar2 = (this->call_stack_).
           super__Vector_base<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar3 = (this->call_stack_).
           super__Vector_base<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ptVar1 = ptVar3 + -1;
  (this->call_stack_).
  super__Vector_base<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::tuple<JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ptVar1;
  if (ptVar2 != ptVar1) {
    ptVar3 = ptVar3 + -2;
    (ptVar3->
    super__Tuple_impl<0UL,_JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ).
    super__Tuple_impl<1UL,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .super__Tuple_impl<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    super__Head_base<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_false>.
    _M_head_impl.__r =
         (ptVar3->
         super__Tuple_impl<0UL,_JEBDebug::ProfilerSection,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         ).
         super__Tuple_impl<1UL,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         .super__Tuple_impl<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         super__Head_base<2UL,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_false>.
         _M_head_impl.__r + total_time.__r;
  }
  return;
}

Assistant:

void end_timer()
        {
            auto end_time = Clock::now();
            auto& [key, start_time, sub_duration] = call_stack_.back();
            auto elapsed = end_time - start_time;
            auto it = profiles_.find(key);
            if (it == profiles_.end())
            {
                it = profiles_.emplace(key, ProfilerData()).first;
                sequence_.push_back(it);
            }
            it->second.add_time(elapsed, elapsed - sub_duration);
            call_stack_.pop_back();
            if (!call_stack_.empty())
                std::get<2>(call_stack_.back()) += elapsed;
        }